

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  cmGeneratorTarget *pcVar2;
  cmGlobalNinjaGenerator *pcVar3;
  cmLocalNinjaGenerator *pcVar4;
  cmMakefile *pcVar5;
  ulong uVar6;
  string *psVar7;
  pointer pcVar8;
  string_view sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_17d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1768;
  bool local_159a;
  bool local_155a;
  string local_1510;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_14e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_14e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0;
  iterator local_14c0;
  size_type local_14b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14b0;
  string local_1498;
  undefined1 local_1478 [8];
  string slCmd;
  undefined1 local_1448 [8];
  string cmakeCommand_1;
  string local_1420;
  undefined1 local_1400 [8];
  cmNinjaRule slRule;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_12b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  iterator local_1288;
  size_type local_1280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1278;
  string local_1260;
  allocator<char> local_1239;
  string local_1238;
  undefined1 local_1218 [8];
  RuleVariables vars_1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander_1;
  string local_10b0;
  cmValue local_1090;
  undefined1 local_1088 [8];
  string cmd_2;
  char *local_1060;
  string local_1058;
  string local_1038;
  undefined1 local_1018 [8];
  cmNinjaRule rule_3;
  string local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0;
  undefined1 local_e90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd_1;
  string local_e70;
  undefined1 local_e50 [8];
  cmNinjaRule rule_2;
  string local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  undefined1 local_cc8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string local_ca8;
  undefined1 local_c88 [8];
  cmNinjaRule rule_1;
  undefined1 local_b50 [8];
  string cmakeCommand;
  Names tgtNames;
  char local_a21;
  string local_a20;
  string local_a00;
  char local_9d9;
  char *local_9d8;
  char local_9c9;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_948;
  allocator<char> local_939;
  value_type local_938;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_918;
  const_iterator local_910;
  string local_900;
  reference local_8e0;
  string *linkCmd;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_898;
  string_view local_878;
  allocator<char> local_861;
  string local_860;
  undefined1 local_840 [8];
  string val;
  string launcher;
  undefined1 local_7f0 [8];
  string linkerLauncher;
  string langFlags;
  string local_790 [32];
  int local_770;
  int local_76c;
  int minor;
  int major;
  ostringstream minorStream;
  ostringstream local_5f0 [8];
  ostringstream majorStream;
  string local_478 [8];
  string targetVersionMinor;
  string targetVersionMajor;
  string local_430;
  cmValue local_410;
  cmValue flag;
  string cmakeLinkVar;
  cmValue local_3c8;
  cmValue DepFileFormat;
  undefined1 local_3a0 [8];
  string cmakeVarLang;
  string responseFlag;
  string local_358;
  undefined1 local_338 [8];
  string lang;
  string linker;
  RuleVariables vars;
  undefined1 local_180 [8];
  cmNinjaRule rule;
  undefined1 local_48 [8];
  string linkRuleName;
  TargetType targetType;
  string *config_local;
  bool useResponseFile_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  linkRuleName.field_2._12_4_ = cmGeneratorTarget::GetType(pcVar2);
  LanguageLinkerRule((string *)local_48,this,config);
  pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGlobalNinjaGenerator::HasRule(pcVar3,(string *)local_48);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&vars.Launcher,(string *)local_48);
    cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_180,(string *)&vars.Launcher);
    std::__cxx11::string::~string((string *)&vars.Launcher);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&linker.field_2 + 8));
    pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar2);
    linker.field_2._8_8_ = std::__cxx11::string::c_str();
    cmState::GetTargetTypeName_abi_cxx11_(linkRuleName.field_2._12_4_);
    vars.CMTargetName = (char *)std::__cxx11::string::c_str();
    pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetLinkerTool((string *)((long)&lang.field_2 + 8),pcVar2,config);
    vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
    TargetLinkLanguage((string *)local_338,this,config);
    vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
    vars.Language = "$AIX_EXPORTS";
    pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmLocalGenerator::IsSplitSwiftBuild((cmLocalGenerator *)pcVar4);
    local_155a = false;
    if (!bVar1) {
      TargetLinkLanguage(&local_358,this,config);
      local_155a = std::operator==(&local_358,"Swift");
      std::__cxx11::string::~string((string *)&local_358);
    }
    if (local_155a != false) {
      vars.FilterPrefix = "$SWIFT_LIBRARY_NAME";
      vars.SwiftLibraryName = "$SWIFT_MODULE";
      vars.SwiftModule = "$SWIFT_MODULE_NAME";
      vars.SwiftOutputFileMapOption = "$SWIFT_SOURCES";
      vars.LanguageCompileFlags = "$DEFINES";
      vars.ObjectFileDir = "$FLAGS";
      vars.Defines = "$INCLUDES";
    }
    std::__cxx11::string::string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    TargetLinkLanguage((string *)&DepFileFormat,this,config);
    cmStrCat<char_const(&)[7],std::__cxx11::string>
              ((string *)local_3a0,(char (*) [7])0x112a736,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DepFileFormat);
    std::__cxx11::string::~string((string *)&DepFileFormat);
    bVar1 = cmGeneratorTarget::HasLinkDependencyFile
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget,config);
    if (bVar1) {
      pcVar5 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
      cmStrCat<std::__cxx11::string&,char_const(&)[23]>
                ((string *)((long)&cmakeLinkVar.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                 (char (*) [23])"_LINKER_DEPFILE_FORMAT");
      local_3c8 = cmMakefile::GetDefinition(pcVar5,(string *)((long)&cmakeLinkVar.field_2 + 8));
      std::__cxx11::string::~string((string *)(cmakeLinkVar.field_2._M_local_buf + 8));
      psVar7 = cmValue::operator_cast_to_string_(&local_3c8);
      std::__cxx11::string::operator=
                ((string *)(rule.DepFile.field_2._M_local_buf + 8),(string *)psVar7);
      std::__cxx11::string::operator=((string *)(rule.Comment.field_2._M_local_buf + 8),"$DEP_FILE")
      ;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flag,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                   "_RESPONSE_FILE_LINK_FLAG");
    pcVar5 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    local_410 = cmMakefile::GetDefinition(pcVar5,(string *)&flag);
    bVar1 = cmValue::operator_cast_to_bool(&local_410);
    if (bVar1) {
      psVar7 = cmValue::operator*[abi_cxx11_(&local_410);
      std::__cxx11::string::operator=
                ((string *)(cmakeVarLang.field_2._M_local_buf + 8),(string *)psVar7);
    }
    else {
      std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),"@");
    }
    if ((useResponseFile) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
      std::__cxx11::string::operator=((string *)(rule.DepType.field_2._M_local_buf + 8),"$RSP_FILE")
      ;
      std::__cxx11::string::operator+=
                ((string *)(cmakeVarLang.field_2._M_local_buf + 8),
                 (string *)(rule.DepType.field_2._M_local_buf + 8));
      pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar3);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in_newline");
      }
      bVar1 = CheckUseResponseFileForLibraries(this,(string *)local_338);
      if (bVar1) {
        std::__cxx11::string::operator+=
                  ((string *)(rule.RspFile.field_2._M_local_buf + 8)," $LINK_PATH $LINK_LIBRARIES");
        vars.Target = "";
      }
      else {
        vars.Target = "$LINK_PATH $LINK_LIBRARIES";
      }
      pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmLocalGenerator::IsSplitSwiftBuild((cmLocalGenerator *)pcVar4);
      local_159a = false;
      if (!bVar1) {
        TargetLinkLanguage(&local_430,this,config);
        local_159a = std::operator==(&local_430,"Swift");
        std::__cxx11::string::~string((string *)&local_430);
      }
      if (local_159a == false) {
        vars.AIXExports = (char *)std::__cxx11::string::c_str();
      }
      else {
        vars.SwiftOutputFileMapOption = (char *)std::__cxx11::string::c_str();
      }
    }
    else {
      vars.AIXExports = "$in";
      vars.Target = "$LINK_PATH $LINK_LIBRARIES";
    }
    vars.Object = "$OBJECT_DIR";
    vars.Objects = "$TARGET_FILE";
    vars.ObjectsQuoted = "$SONAME_FLAG";
    vars.SONameFlag = "$SONAME";
    vars.TargetSOName = "$INSTALLNAME_DIR";
    vars.CMTargetType = "$TARGET_PDB";
    std::__cxx11::string::string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_478);
    std::__cxx11::ostringstream::ostringstream(local_5f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&minor);
    pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetTargetVersion(pcVar2,&local_76c,&local_770);
    std::ostream::operator<<(local_5f0,local_76c);
    std::ostream::operator<<(&minor,local_770);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)(targetVersionMinor.field_2._M_local_buf + 8),local_790);
    std::__cxx11::string::~string(local_790);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_478,(string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&minor);
    std::__cxx11::ostringstream::~ostringstream(local_5f0);
    vars.TargetCompilePDB = (char *)std::__cxx11::string::c_str();
    vars.TargetVersionMajor = (char *)std::__cxx11::string::c_str();
    vars.ObjectFileDir = "$FLAGS";
    vars.Linker = "$LINK_FLAGS";
    vars.LinkFlags = "$MANIFESTS";
    std::__cxx11::string::string((string *)(linkerLauncher.field_2._M_local_buf + 8));
    if (linkRuleName.field_2._12_4_ != 0) {
      std::__cxx11::string::operator+=
                ((string *)(linkerLauncher.field_2._M_local_buf + 8),
                 "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS");
      vars.Manifests = (char *)std::__cxx11::string::c_str();
    }
    cmCommonTargetGenerator::GetLinkerLauncher
              ((string *)local_7f0,(cmCommonTargetGenerator *)this,config);
    sVar9 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_7f0);
    bVar1 = cmNonempty(sVar9);
    if (bVar1) {
      vars.RegisterFile = (char *)std::__cxx11::string::c_str();
    }
    std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
    pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_860,"RULE_LAUNCH_LINK",&local_861);
    cmLocalGenerator::GetRuleLauncher
              ((string *)local_840,(cmLocalGenerator *)pcVar4,pcVar2,&local_860,config);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator(&local_861);
    local_878 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_840);
    bVar1 = cmNonempty(local_878);
    if (bVar1) {
      rulePlaceholderExpander._M_t.
      super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
      .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._7_1_ = 0x20;
      cmStrCat<std::__cxx11::string&,char>
                (&local_898,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840,
                 (char *)((long)&rulePlaceholderExpander._M_t.
                                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>.
                                 _M_head_impl + 7));
      std::__cxx11::string::operator=((string *)(val.field_2._M_local_buf + 8),(string *)&local_898)
      ;
      std::__cxx11::string::~string((string *)&local_898);
    }
    pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    (*(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[6])
              (&linkCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ComputeLinkCmd((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2,this,config);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    linkCmd = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&linkCmd);
      if (!bVar1) break;
      local_8e0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                (&local_900,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&val.field_2 + 8),local_8e0);
      std::__cxx11::string::operator=((string *)local_8e0,(string *)&local_900);
      std::__cxx11::string::~string((string *)&local_900);
      pcVar8 = std::
               unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                             *)&linkCmds.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (pcVar8,(cmOutputConverter *)pcVar4,local_8e0,
                 (RuleVariables *)((long)&linker.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmNinjaRemoveNoOpCommands>
              (&__range2);
    local_918._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_910,&local_918);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"$PRE_LINK",&local_939);
    local_948 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2,local_910,&local_938);
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator(&local_939);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
               (char (*) [12])"$POST_BUILD");
    pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::string::string((string *)&local_988);
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_968,pcVar4,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,config,config,&local_988,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=
              ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_968);
    std::__cxx11::string::~string((string *)&local_968);
    std::__cxx11::string::~string((string *)&local_988);
    TargetLinkLanguage(&local_9c8,this,config);
    local_9c9 = ' ';
    local_9d8 = GetVisibleTypeName(this);
    local_9d9 = '.';
    cmStrCat<char_const(&)[18],std::__cxx11::string,char,char_const*,char>
              (&local_9a8,(char (*) [18])"Rule for linking ",&local_9c8,&local_9c9,&local_9d8,
               &local_9d9);
    std::__cxx11::string::operator=
              ((string *)(rule.Description.field_2._M_local_buf + 8),(string *)&local_9a8);
    std::__cxx11::string::~string((string *)&local_9a8);
    std::__cxx11::string::~string((string *)&local_9c8);
    TargetLinkLanguage(&local_a20,this,config);
    local_a21 = ' ';
    tgtNames.SharedObject.field_2._8_8_ = GetVisibleTypeName(this);
    cmStrCat<char_const(&)[9],std::__cxx11::string,char,char_const*,char_const(&)[14]>
              (&local_a00,(char (*) [9])"Linking ",&local_a20,&local_a21,
               (char **)((long)&tgtNames.SharedObject.field_2 + 8),(char (*) [14])0x11501b3);
    std::__cxx11::string::operator=
              ((string *)(rule.Command.field_2._M_local_buf + 8),(string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::string::operator=((string *)(rule.RspContent.field_2._M_local_buf + 8),"$RESTAT");
    pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)local_180);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&linkCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_840);
    std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_7f0);
    std::__cxx11::string::~string((string *)(linkerLauncher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&flag);
    std::__cxx11::string::~string((string *)local_3a0);
    std::__cxx11::string::~string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::string::~string((string *)(lang.field_2._M_local_buf + 8));
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_180);
  }
  TargetNames((Names *)((long)&cmakeCommand.field_2 + 8),this,config);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&tgtNames.Base.field_2 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&tgtNames.Output.field_2 + 8));
  if (bVar1) {
    pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::IsFrameworkOnApple(pcVar2);
    if (!bVar1) {
      pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      sVar9 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      rule_1._288_8_ = sVar9._M_len;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)local_b50,(cmOutputConverter *)pcVar4,sVar9,SHELL,false);
      if (linkRuleName.field_2._12_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ca8,"CMAKE_SYMLINK_EXECUTABLE",
                   (allocator<char> *)
                   ((long)&cmd.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_c88,&local_ca8);
        std::__cxx11::string::~string((string *)&local_ca8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&cmd.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_cc8);
        std::operator+(&local_ce8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b50," -E cmake_symlink_executable $in $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_cc8,&local_ce8);
        std::__cxx11::string::~string((string *)&local_ce8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[12]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_cc8,
                   (char (*) [12])"$POST_BUILD");
        pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        std::__cxx11::string::string((string *)&rule_2.Generator);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_d08,pcVar4,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_cc8,config,config,(string *)&rule_2.Generator,(cmGeneratorTarget *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Name.field_2._M_local_buf + 8),(string *)&local_d08);
        std::__cxx11::string::~string((string *)&local_d08);
        std::__cxx11::string::~string((string *)&rule_2.Generator);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_cc8);
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Command.field_2._M_local_buf + 8),
                   "Creating executable symlink $out");
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Description.field_2._M_local_buf + 8),
                   "Rule for creating executable symlink.");
        pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)local_c88);
        cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_c88);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e70,"CMAKE_SYMLINK_LIBRARY",
                   (allocator<char> *)
                   ((long)&cmd_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_e50,&local_e70);
        std::__cxx11::string::~string((string *)&local_e70);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&cmd_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e90);
        std::operator+(&local_eb0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b50," -E cmake_symlink_library $in $SONAME $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e90,&local_eb0);
        std::__cxx11::string::~string((string *)&local_eb0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[12]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e90,
                   (char (*) [12])"$POST_BUILD");
        pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        std::__cxx11::string::string((string *)&rule_3.Generator);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_ed0,pcVar4,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e90,config,config,(string *)&rule_3.Generator,(cmGeneratorTarget *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Name.field_2._M_local_buf + 8),(string *)&local_ed0);
        std::__cxx11::string::~string((string *)&local_ed0);
        std::__cxx11::string::~string((string *)&rule_3.Generator);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e90);
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Command.field_2._M_local_buf + 8),
                   "Creating library symlink $out");
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Description.field_2._M_local_buf + 8),
                   "Rule for creating library symlink.");
        pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)local_e50);
        cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_e50);
      }
      std::__cxx11::string::~string((string *)local_b50);
    }
  }
  pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGeneratorTarget::IsApple(pcVar2);
  if (bVar1) {
    pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::HasImportLibrary(pcVar2,config);
    if (bVar1) {
      TextStubsGeneratorRule(&local_1038,this,config);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_1018,&local_1038);
      std::__cxx11::string::~string((string *)&local_1038);
      local_1060 = GetVisibleTypeName(this);
      cmd_2.field_2._M_local_buf[0xf] = '.';
      cmStrCat<char_const(&)[42],char_const*,char>
                (&local_1058,(char (*) [42])"Rule for generating text-based stubs for ",&local_1060,
                 cmd_2.field_2._M_local_buf + 0xf);
      std::__cxx11::string::operator=
                ((string *)(rule_3.Description.field_2._M_local_buf + 8),(string *)&local_1058);
      std::__cxx11::string::~string((string *)&local_1058);
      std::__cxx11::string::operator=
                ((string *)(rule_3.Command.field_2._M_local_buf + 8),
                 "Creating text-based stubs $out");
      pcVar5 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10b0,"CMAKE_CREATE_TEXT_STUBS",
                 (allocator<char> *)
                 ((long)&rulePlaceholderExpander_1._M_t.
                         super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                         .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7
                 ));
      local_1090 = cmMakefile::GetDefinition(pcVar5,&local_10b0);
      psVar7 = cmValue::operator_cast_to_string_(&local_1090);
      std::__cxx11::string::string((string *)local_1088,(string *)psVar7);
      std::__cxx11::string::~string((string *)&local_10b0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&rulePlaceholderExpander_1._M_t.
                         super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                         .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7
                 ));
      pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      (*(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
        _vptr_cmOutputConverter[6])(&vars_1.Launcher);
      cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_1218);
      vars_1.Objects = "$in";
      pcVar8 = std::
               unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                             *)&vars_1.Launcher);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1238,"$out",&local_1239);
      cmRulePlaceholderExpander::SetTargetImpLib(pcVar8,&local_1238);
      std::__cxx11::string::~string((string *)&local_1238);
      std::allocator<char>::~allocator(&local_1239);
      pcVar8 = std::
               unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                             *)&vars_1.Launcher);
      pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (pcVar8,(cmOutputConverter *)pcVar4,(string *)local_1088,(RuleVariables *)local_1218
                );
      pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      local_12b0 = &local_12a8;
      std::__cxx11::string::string((string *)local_12b0,(string *)local_1088);
      local_1288 = &local_12a8;
      local_1280 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_12b1);
      __l_00._M_len = local_1280;
      __l_00._M_array = local_1288;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1278,__l_00,&local_12b1);
      std::__cxx11::string::string((string *)&slRule.Generator);
      cmLocalNinjaGenerator::BuildCommandLine
                (&local_1260,pcVar4,&local_1278,config,config,(string *)&slRule.Generator,
                 (cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=
                ((string *)(rule_3.Name.field_2._M_local_buf + 8),(string *)&local_1260);
      std::__cxx11::string::~string((string *)&local_1260);
      std::__cxx11::string::~string((string *)&slRule.Generator);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1278);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_12b1);
      local_1768 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1288;
      do {
        local_1768 = local_1768 + -1;
        std::__cxx11::string::~string((string *)local_1768);
      } while (local_1768 != &local_12a8);
      pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)local_1018);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&tgtNames.Real.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&tgtNames.ImportOutput.field_2 + 8));
      if (bVar1) {
        pcVar2 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
        bVar1 = cmGeneratorTarget::IsFrameworkOnApple(pcVar2);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1420,"CMAKE_SYMLINK_IMPORT_LIBRARY",
                     (allocator<char> *)(cmakeCommand_1.field_2._M_local_buf + 0xf));
          cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_1400,&local_1420);
          std::__cxx11::string::~string((string *)&local_1420);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(cmakeCommand_1.field_2._M_local_buf + 0xf));
          pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
          psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
          sVar9 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
          slCmd.field_2._8_8_ = sVar9._M_len;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    ((string *)local_1448,(cmOutputConverter *)pcVar4,sVar9,SHELL,false);
          cmStrCat<std::__cxx11::string&,char_const(&)[43]>
                    ((string *)local_1478,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1448
                     ,(char (*) [43])" -E cmake_symlink_library $in $SONAME $out");
          pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
          local_14e8 = &local_14e0;
          std::__cxx11::string::string((string *)local_14e8,(string *)local_1478);
          local_14c0 = &local_14e0;
          local_14b8 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_14e9);
          __l._M_len = local_14b8;
          __l._M_array = local_14c0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_14b0,__l,&local_14e9);
          std::__cxx11::string::string((string *)&local_1510);
          cmLocalNinjaGenerator::BuildCommandLine
                    (&local_1498,pcVar4,&local_14b0,config,config,&local_1510,
                     (cmGeneratorTarget *)0x0);
          std::__cxx11::string::operator=
                    ((string *)(slRule.Name.field_2._M_local_buf + 8),(string *)&local_1498);
          std::__cxx11::string::~string((string *)&local_1498);
          std::__cxx11::string::~string((string *)&local_1510);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_14b0);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_14e9);
          local_17d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_14c0;
          do {
            local_17d0 = local_17d0 + -1;
            std::__cxx11::string::~string((string *)local_17d0);
          } while (local_17d0 != &local_14e0);
          std::__cxx11::string::~string((string *)local_1478);
          std::__cxx11::string::~string((string *)local_1448);
          std::__cxx11::string::operator=
                    ((string *)(slRule.Command.field_2._M_local_buf + 8),
                     "Creating import library symlink $out");
          std::__cxx11::string::operator=
                    ((string *)(slRule.Description.field_2._M_local_buf + 8),
                     "Rule for creating import library symlink.");
          pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
          cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)local_1400);
          cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_1400);
        }
      }
      std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
      ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   *)&vars_1.Launcher);
      std::__cxx11::string::~string((string *)local_1088);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_1018);
    }
  }
  cmGeneratorTarget::Names::~Names((Names *)((long)&cmakeCommand.field_2 + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile,
                                                 const std::string& config)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule(config);
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType).c_str();

    std::string linker = this->GetGeneratorTarget()->GetLinkerTool(config);
    vars.Linker = linker.c_str();
    std::string lang = this->TargetLinkLanguage(config);
    vars.Language = lang.c_str();
    vars.AIXExports = "$AIX_EXPORTS";

    if (!this->GetLocalGenerator()->IsSplitSwiftBuild() &&
        this->TargetLinkLanguage(config) == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang =
      cmStrCat("CMAKE_", this->TargetLinkLanguage(config));

    if (this->GeneratorTarget->HasLinkDependencyFile(config)) {
      auto DepFileFormat = this->GetMakefile()->GetDefinition(
        cmStrCat(cmakeVarLang, "_LINKER_DEPFILE_FORMAT"));
      rule.DepType = DepFileFormat;
      rule.DepFile = "$DEP_FILE";
    }

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = *flag;
    } else {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }

      // If libraries in rsp is enable
      if (this->CheckUseResponseFileForLibraries(lang)) {
        rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
        vars.LinkLibraries = "";
      } else {
        vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }

      if (!this->GetLocalGenerator()->IsSplitSwiftBuild() &&
          this->TargetLinkLanguage(config) == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string linkerLauncher = this->GetLinkerLauncher(config);
    if (cmNonempty(linkerLauncher)) {
      vars.Launcher = linkerLauncher.c_str();
    }

    std::string launcher;
    std::string val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK", config);
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd(config);
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  auto const tgtNames = this->TargetNames(config);
  if (tgtNames.Output != tgtNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }

  if (this->GetGeneratorTarget()->IsApple() &&
      this->GetGeneratorTarget()->HasImportLibrary(config)) {
    cmNinjaRule rule(this->TextStubsGeneratorRule(config));
    rule.Comment = cmStrCat("Rule for generating text-based stubs for ",
                            this->GetVisibleTypeName(), '.');
    rule.Description = "Creating text-based stubs $out";

    std::string cmd =
      this->GetMakefile()->GetDefinition("CMAKE_CREATE_TEXT_STUBS");
    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.Target = "$in";
    rulePlaceholderExpander->SetTargetImpLib("$out");
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                 cmd, vars);

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine({ cmd }, config, config);
    this->GetGlobalGenerator()->AddRule(rule);

    if (tgtNames.ImportOutput != tgtNames.ImportReal &&
        !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
      cmNinjaRule slRule("CMAKE_SYMLINK_IMPORT_LIBRARY");
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        std::string slCmd =
          cmStrCat(cmakeCommand, " -E cmake_symlink_library $in $SONAME $out");
        slRule.Command = this->GetLocalGenerator()->BuildCommandLine(
          { slCmd }, config, config);
      }
      slRule.Description = "Creating import library symlink $out";
      slRule.Comment = "Rule for creating import library symlink.";
      this->GetGlobalGenerator()->AddRule(slRule);
    }
  }
}